

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

Frc_Man_t * Frc_ManStart(Gia_Man_t *pGia)

{
  uint uVar1;
  Frc_Obj_t *pObj;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int v;
  Frc_Man_t *pFVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  long lVar9;
  int iVar10;
  int i;
  int iVar11;
  int local_7c;
  int nFanios;
  int nObjs;
  
  Frc_ManCreateRefsSpecial(pGia);
  Frc_ManTransformRefs(pGia,&nObjs,&nFanios);
  Gia_ManFillValue(pGia);
  pFVar6 = (Frc_Man_t *)calloc(1,0x38);
  pFVar6->pGia = pGia;
  pFVar6->nRegs = pGia->nRegs;
  p = Vec_IntAlloc(pGia->vCis->nSize);
  pFVar6->vCis = p;
  p_00 = Vec_IntAlloc(pGia->vCos->nSize);
  pFVar6->vCos = p_00;
  uVar1 = nObjs * 6 + nFanios * 2;
  pFVar6->nObjData = uVar1;
  puVar7 = (uint *)calloc((long)(int)uVar1,4);
  pFVar6->pObjData = (int *)puVar7;
  pGVar8 = pGia->pObjs;
  pGVar8->Value = 0;
  *puVar7 = *puVar7 & 0xf;
  uVar2 = Gia_ObjRefNum(pGia,pGVar8);
  puVar7[1] = uVar2;
  iVar11 = uVar2 + (*puVar7 >> 4);
  pFVar6->nObjs = 1;
  iVar10 = 1;
  while( true ) {
    uVar2 = iVar11 + 6;
    if ((pGia->vCis->nSize <= iVar10 + -1) ||
       (pGVar8 = Gia_ManCi(pGia,iVar10 + -1), pGVar8 == (Gia_Obj_t *)0x0)) break;
    pGVar8->Value = uVar2;
    Vec_IntPush(p,uVar2);
    puVar7[(long)(int)uVar2 + 3] = uVar2;
    puVar7[(int)uVar2] = puVar7[(int)uVar2] & 0xf;
    uVar3 = Gia_ObjRefNum(pGia,pGVar8);
    puVar7[(long)(int)uVar2 + 1] = uVar3;
    uVar5 = puVar7[(int)uVar2];
    puVar7[(int)uVar2] = uVar5 | 1;
    iVar11 = (uVar5 >> 4) + uVar3 + uVar2;
    iVar10 = iVar10 + 1;
    pFVar6->nObjs = iVar10;
  }
  p_01 = Vec_IntAlloc(100);
  p_02 = Vec_IntAlloc(100);
  iVar11 = 0;
  local_7c = 1;
  do {
    if ((pGia->nObjs <= iVar11) || (pGVar8 = Gia_ManObj(pGia,iVar11), pGVar8 == (Gia_Obj_t *)0x0)) {
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      iVar11 = 0;
      while ((iVar11 < pGia->vCos->nSize &&
             (pGVar8 = Gia_ManCo(pGia,iVar11), pGVar8 != (Gia_Obj_t *)0x0))) {
        pGVar8->Value = uVar2;
        Vec_IntPush(p_00,uVar2);
        puVar7[(long)(int)uVar2 + 3] = uVar2;
        uVar5 = puVar7[(int)uVar2];
        puVar7[(long)(int)uVar2 + 1] = 0;
        puVar7[(int)uVar2] = uVar5 & 0xd | 0x12;
        Frc_ObjAddFanin((Frc_Obj_t *)(puVar7 + (int)uVar2),
                        (Frc_Obj_t *)
                        (puVar7 + (int)pGVar8[-(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)].
                                       Value));
        uVar2 = puVar7[(long)(int)uVar2 + 1] + (puVar7[(int)uVar2] >> 4) + uVar2 + 6;
        pFVar6->nObjs = iVar11 + iVar10 + 1;
        iVar11 = iVar11 + 1;
      }
      Gia_ManCleanMark0(pGia);
      if ((local_7c - iVar10) + p->nSize + p_00->nSize != iVar11) {
        __assert_fail("nNodes == Frc_ManNodeNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0x20f,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
      }
      if (nObjs - iVar10 != iVar11) {
        __assert_fail("nObjs == p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0x210,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
      }
      if (uVar2 == uVar1) {
        iVar11 = 0;
        do {
          if ((pGia->nObjs <= iVar11) ||
             (pGVar8 = Gia_ManObj(pGia,iVar11), pGVar8 == (Gia_Obj_t *)0x0)) {
            if (pGia->pRefs != (int *)0x0) {
              free(pGia->pRefs);
              pGia->pRefs = (int *)0x0;
            }
            return pFVar6;
          }
          lVar9 = (long)(int)pGVar8->Value;
          if (lVar9 != -1) {
            if (puVar7[lVar9] >> 4 != puVar7[lVar9 + 5]) {
              __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                            ,0x21a,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
            }
            if (puVar7[lVar9 + 1] != puVar7[lVar9 + 2]) {
              __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                            ,0x21b,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
            }
            puVar7[lVar9 + 2] = 0;
            puVar7[lVar9 + 5] = 0;
          }
          iVar11 = iVar11 + 1;
        } while( true );
      }
      __assert_fail("hHandle == p->nObjData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0x211,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
    }
    uVar5 = (uint)*(undefined8 *)pGVar8;
    if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
      iVar4 = Gia_ObjRefNum(pGia,pGVar8);
      if ((uVar5 >> 0x1e & 1) == 0) {
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x1e1,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
      }
      else {
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x1e4,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        Frc_ManCollectSuper(pGia,pGVar8,p_01,p_02);
        pGVar8->Value = uVar2;
        pObj = (Frc_Obj_t *)(puVar7 + (int)uVar2);
        puVar7[(long)(int)uVar2 + 3] = uVar2;
        iVar4 = p_01->nSize;
        puVar7[(int)uVar2] = puVar7[(int)uVar2] & 0xf | iVar4 << 4;
        uVar5 = Gia_ObjRefNum(pGia,pGVar8);
        puVar7[(long)(int)uVar2 + 1] = uVar5;
        i = 0;
        if (iVar4 < 1) {
          iVar4 = i;
        }
        for (; iVar4 != i; i = i + 1) {
          v = Vec_IntEntry(p_01,i);
          pGVar8 = Gia_ManObj(pGia,v);
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          Frc_ObjAddFanin(pObj,(Frc_Obj_t *)(puVar7 + (int)pGVar8->Value));
        }
        uVar2 = uVar2 + (*(uint *)pObj >> 4) + pObj->nFanouts + 6;
        local_7c = local_7c + 1;
        iVar10 = iVar10 + 1;
        pFVar6->nObjs = iVar10;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

Frc_Man_t * Frc_ManStart( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pFanin;//, * pObjRi, * pObjRo;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Frc_ManCreateRefsSpecial( pGia );
    Frc_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * nObjs + 2 * nFanios;
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Frc_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Frc_ManObj( p, Gia_ObjValue(pFanin) ); 
            Frc_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}